

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ASEParser.cpp
# Opt level: O3

void __thiscall Assimp::ASE::Parser::ParseLV1SceneBlock(Parser *this)

{
  bool bVar1;
  int iVar2;
  byte bVar3;
  byte *pbVar4;
  long lVar5;
  byte *pbVar6;
  uint *iOut;
  int local_54;
  
  local_54 = 0;
LAB_003f1b8f:
  do {
    while( true ) {
      pbVar6 = (byte *)this->filePtr;
      bVar3 = *pbVar6;
      if (bVar3 == 0x2a) break;
      if (bVar3 == 0) {
        return;
      }
      if (bVar3 == 0x7b) {
        local_54 = local_54 + 1;
      }
      else {
        if (bVar3 != 0x7d) goto LAB_003f1dbc;
        local_54 = local_54 + -1;
        if (local_54 == 0) {
          this->filePtr = (char *)(pbVar6 + 1);
          SkipToNextToken(this);
          return;
        }
      }
      bVar1 = false;
LAB_003f1de8:
      this->bLastWasEndLine = bVar1;
      this->filePtr = (char *)(pbVar6 + 1);
    }
    pbVar4 = pbVar6 + 1;
    this->filePtr = (char *)pbVar4;
    iVar2 = strncmp("SCENE_BACKGROUND_STATIC",(char *)pbVar4,0x17);
    if (iVar2 == 0) {
      bVar3 = pbVar6[0x18];
      if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
        pbVar4 = pbVar6 + 0x19;
        if (bVar3 == 0) {
          pbVar4 = pbVar6 + 0x18;
        }
        this->filePtr = (char *)pbVar4;
        lVar5 = 8;
        do {
          ParseLV4MeshFloat(this,(ai_real *)((long)&this->filePtr + lVar5));
          lVar5 = lVar5 + 4;
        } while (lVar5 != 0x14);
        goto LAB_003f1b8f;
      }
    }
    iVar2 = strncmp("SCENE_AMBIENT_STATIC",(char *)pbVar4,0x14);
    if (iVar2 == 0) {
      bVar3 = pbVar6[0x15];
      if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
      goto LAB_003f1bd6;
      pbVar4 = pbVar6 + 0x16;
      if (bVar3 == 0) {
        pbVar4 = pbVar6 + 0x15;
      }
      this->filePtr = (char *)pbVar4;
      lVar5 = 0x14;
      do {
        ParseLV4MeshFloat(this,(ai_real *)((long)&this->filePtr + lVar5));
        lVar5 = lVar5 + 4;
      } while (lVar5 != 0x20);
    }
    else {
LAB_003f1bd6:
      iVar2 = strncmp("SCENE_FIRSTFRAME",(char *)pbVar4,0x10);
      if (iVar2 != 0) {
LAB_003f1bf2:
        iVar2 = strncmp("SCENE_LASTFRAME",(char *)pbVar4,0xf);
        if (iVar2 == 0) {
          bVar3 = pbVar6[0x10];
          if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
            pbVar4 = pbVar6 + 0x10;
            lVar5 = 0x11;
            iOut = &this->iLastFrame;
            goto LAB_003f1d98;
          }
        }
        iVar2 = strncmp("SCENE_FRAMESPEED",(char *)pbVar4,0x10);
        if (iVar2 == 0) {
          bVar3 = pbVar6[0x11];
          if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
            pbVar4 = pbVar6 + 0x11;
            lVar5 = 0x12;
            iOut = &this->iFrameSpeed;
            goto LAB_003f1d98;
          }
        }
        iVar2 = strncmp("SCENE_TICKSPERFRAME",(char *)pbVar4,0x13);
        if (iVar2 == 0) {
          bVar3 = pbVar6[0x14];
          if (((ulong)bVar3 < 0x21) && ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) != 0)) {
            pbVar4 = pbVar6 + 0x14;
            lVar5 = 0x15;
            iOut = &this->iTicksPerFrame;
            goto LAB_003f1d98;
          }
        }
        bVar3 = *pbVar4;
        pbVar6 = pbVar4;
LAB_003f1dbc:
        bVar1 = false;
        if ((bVar3 < 0xe) && ((0x3401U >> (bVar3 & 0x1f) & 1) != 0)) {
          if (this->bLastWasEndLine == false) {
            this->iLineNumber = this->iLineNumber + 1;
            bVar1 = true;
          }
          else {
            bVar1 = false;
          }
        }
        goto LAB_003f1de8;
      }
      bVar3 = pbVar6[0x11];
      if ((0x20 < (ulong)bVar3) || ((0x100003601U >> ((ulong)bVar3 & 0x3f) & 1) == 0))
      goto LAB_003f1bf2;
      pbVar4 = pbVar6 + 0x11;
      lVar5 = 0x12;
      iOut = &this->iFirstFrame;
LAB_003f1d98:
      pbVar6 = pbVar6 + lVar5;
      if (bVar3 == 0) {
        pbVar6 = pbVar4;
      }
      this->filePtr = (char *)pbVar6;
      ParseLV4MeshLong(this,iOut);
    }
  } while( true );
}

Assistant:

void Parser::ParseLV1SceneBlock()
{
    AI_ASE_PARSER_INIT();
    while (true)
    {
        if ('*' == *filePtr)
        {
            ++filePtr;
            if (TokenMatch(filePtr,"SCENE_BACKGROUND_STATIC",23))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrBackground.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_AMBIENT_STATIC",20))

            {
                // parse a color triple and assume it is really the bg color
                ParseLV4MeshFloatTriple( &m_clrAmbient.r );
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FIRSTFRAME",16))
            {
                ParseLV4MeshLong(iFirstFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_LASTFRAME",15))
            {
                ParseLV4MeshLong(iLastFrame);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_FRAMESPEED",16))
            {
                ParseLV4MeshLong(iFrameSpeed);
                continue;
            }
            if (TokenMatch(filePtr,"SCENE_TICKSPERFRAME",19))
            {
                ParseLV4MeshLong(iTicksPerFrame);
                continue;
            }
        }
        AI_ASE_HANDLE_TOP_LEVEL_SECTION();
    }
}